

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::TryConsumeEndOfDeclaration
          (Parser *this,char *text,LocationRecorder *location)

{
  bool bVar1;
  string leading;
  string trailing;
  string local_58;
  string local_38;
  
  bVar1 = LookingAt(this,text);
  if (bVar1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_38.field_2._M_local_buf[0] = '\0';
    io::Tokenizer::NextWithComments
              (this->input_,&local_38,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0,&local_58);
    std::__cxx11::string::swap((string *)&local_58);
    if (location != (LocationRecorder *)0x0) {
      LocationRecorder::AttachComments(location,&local_58,&local_38);
    }
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return bVar1;
}

Assistant:

bool Parser::TryConsumeEndOfDeclaration(const char* text,
                                        const LocationRecorder* location) {
  if (LookingAt(text)) {
    string leading, trailing;
    input_->NextWithComments(&trailing, NULL, &leading);

    // Save the leading comments for next time, and recall the leading comments
    // from last time.
    leading.swap(upcoming_doc_comments_);

    if (location != NULL) {
      location->AttachComments(&leading, &trailing);
    }
    return true;
  } else {
    return false;
  }
}